

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeFreeCursorNN(Vdbe *p,VdbeCursor *pCx)

{
  long *plVar1;
  int *piVar2;
  u8 uVar3;
  VdbeSorter *pSorter;
  sqlite3 *db;
  long *plVar4;
  BtCursor *pCur;
  Btree *p_00;
  BtShared *pBVar5;
  BtCursor *pBVar6;
  MemPage *pPage;
  BtCursor *pBVar7;
  BtCursor **ppBVar8;
  
  if ((pCx->field_0x5 & 0x10) != 0) {
    freeCursorWithCache(p,pCx);
    return;
  }
  uVar3 = pCx->eCurType;
  if (uVar3 == '\0') {
    pCur = (pCx->uc).pCursor;
    p_00 = pCur->pBtree;
    if (p_00 != (Btree *)0x0) {
      pBVar5 = pCur->pBt;
      if ((p_00->sharable != '\0') &&
         (p_00->wantToLock = p_00->wantToLock + 1, p_00->locked == '\0')) {
        btreeLockCarefully(p_00);
      }
      pBVar7 = pBVar5->pCursor;
      ppBVar8 = &pBVar5->pCursor;
      if (pBVar5->pCursor == pCur) {
LAB_0014042d:
        *ppBVar8 = pCur->pNext;
      }
      else {
        do {
          pBVar6 = pBVar7->pNext;
          if (pBVar6 == pCur) {
            ppBVar8 = &pBVar7->pNext;
            goto LAB_0014042d;
          }
          pBVar7 = pBVar6;
        } while (pBVar6 != (BtCursor *)0x0);
      }
      btreeReleaseAllCursorPages(pCur);
      if ((pBVar5->inTransaction == '\0') && (pPage = pBVar5->pPage1, pPage != (MemPage *)0x0)) {
        pBVar5->pPage1 = (MemPage *)0x0;
        releasePageOne(pPage);
      }
      sqlite3_free(pCur->aOverflow);
      sqlite3_free(pCur->pKey);
      if (((pBVar5->openFlags & 4) == 0) || (pBVar5->pCursor != (BtCursor *)0x0)) {
        if (p_00->sharable != '\0') {
          piVar2 = &p_00->wantToLock;
          *piVar2 = *piVar2 + -1;
          if (*piVar2 == 0) {
            unlockBtreeMutex(p_00);
          }
        }
      }
      else {
        sqlite3BtreeClose(p_00);
      }
      pCur->pBtree = (Btree *)0x0;
    }
  }
  else {
    if (uVar3 == '\x02') {
      plVar4 = *(long **)(pCx->uc).pCursor;
      plVar1 = plVar4 + 1;
      *(int *)plVar1 = (int)*plVar1 + -1;
      (**(code **)(*plVar4 + 0x38))();
      return;
    }
    if ((uVar3 == '\x01') && (pSorter = (pCx->uc).pSorter, pSorter != (VdbeSorter *)0x0)) {
      db = p->db;
      sqlite3VdbeSorterReset(db,pSorter);
      sqlite3_free((pSorter->list).aMemory);
      sqlite3DbFreeNN(db,pSorter);
      (pCx->uc).pCursor = (BtCursor *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursorNN(Vdbe *p, VdbeCursor *pCx){
  if( pCx->colCache ){
    freeCursorWithCache(p, pCx);
    return;
  }
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      assert( pCx->uc.pCursor!=0 );
      sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}